

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O0

void gen_field_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  int n_local;
  int hint_local;
  void *data_local;
  fb_compound_type_t *ct_local;
  fb_output_t *out_local;
  
  println(out,"buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);",(ulong)(uint)n);
  println(out,"if (mark != buf) {");
  out->indent = out->indent + 1;
  gen_field_match_handler(out,ct,data,hint);
  if (out->indent != 0) {
    out->indent = out->indent + -1;
    println(out,"} else {");
    out->indent = out->indent + 1;
    return;
  }
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x2d8,"void gen_field_match(fb_output_t *, fb_compound_type_t *, void *, int, int)"
               );
}

Assistant:

static void gen_field_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);", n);
    println(out, "if (mark != buf) {"); indent();
    gen_field_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}